

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_MakeFormulaFI2(uint tFun,Dtt_FunImpl_t *pFun,Vec_Vec_t *vLibImpl,int NP,char *sFI1,char *sF
                       ,int fPrint,FILE *pFile)

{
  byte bVar1;
  uint NP_00;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char sFI2 [100];
  char local_98 [104];
  
  local_98[0x50] = '\0';
  local_98[0x51] = '\0';
  local_98[0x52] = '\0';
  local_98[0x53] = '\0';
  local_98[0x54] = '\0';
  local_98[0x55] = '\0';
  local_98[0x56] = '\0';
  local_98[0x57] = '\0';
  local_98[0x58] = '\0';
  local_98[0x59] = '\0';
  local_98[0x5a] = '\0';
  local_98[0x5b] = '\0';
  local_98[0x5c] = '\0';
  local_98[0x5d] = '\0';
  local_98[0x5e] = '\0';
  local_98[0x5f] = '\0';
  local_98[0x40] = '\0';
  local_98[0x41] = '\0';
  local_98[0x42] = '\0';
  local_98[0x43] = '\0';
  local_98[0x44] = '\0';
  local_98[0x45] = '\0';
  local_98[0x46] = '\0';
  local_98[0x47] = '\0';
  local_98[0x48] = '\0';
  local_98[0x49] = '\0';
  local_98[0x4a] = '\0';
  local_98[0x4b] = '\0';
  local_98[0x4c] = '\0';
  local_98[0x4d] = '\0';
  local_98[0x4e] = '\0';
  local_98[0x4f] = '\0';
  local_98[0x30] = '\0';
  local_98[0x31] = '\0';
  local_98[0x32] = '\0';
  local_98[0x33] = '\0';
  local_98[0x34] = '\0';
  local_98[0x35] = '\0';
  local_98[0x36] = '\0';
  local_98[0x37] = '\0';
  local_98[0x38] = '\0';
  local_98[0x39] = '\0';
  local_98[0x3a] = '\0';
  local_98[0x3b] = '\0';
  local_98[0x3c] = '\0';
  local_98[0x3d] = '\0';
  local_98[0x3e] = '\0';
  local_98[0x3f] = '\0';
  local_98[0x20] = '\0';
  local_98[0x21] = '\0';
  local_98[0x22] = '\0';
  local_98[0x23] = '\0';
  local_98[0x24] = '\0';
  local_98[0x25] = '\0';
  local_98[0x26] = '\0';
  local_98[0x27] = '\0';
  local_98[0x28] = '\0';
  local_98[0x29] = '\0';
  local_98[0x2a] = '\0';
  local_98[0x2b] = '\0';
  local_98[0x2c] = '\0';
  local_98[0x2d] = '\0';
  local_98[0x2e] = '\0';
  local_98[0x2f] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  local_98[0x18] = '\0';
  local_98[0x19] = '\0';
  local_98[0x1a] = '\0';
  local_98[0x1b] = '\0';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  local_98[0x60] = '\0';
  local_98[0x61] = '\0';
  local_98[0x62] = '\0';
  local_98[99] = '\0';
  uVar3 = pFun->FI2;
  if (uVar3 == 0) {
    iVar6 = 0;
    uVar3 = 0;
    do {
      uVar4 = pFun->NP2 >> ((char)NP * '\x04' & 0x1fU);
      uVar3 = uVar3 | ((uVar4 ^ NP) & 8 | uVar4 & 7) << ((byte)iVar6 & 0x1f);
      NP = NP >> 4;
      iVar6 = iVar6 + 4;
    } while (iVar6 != 0x14);
    Dtt_MakePI(uVar3,local_98);
    Dtt_FunImpl2Str(pFun->Type,sFI1,local_98,sF);
    if (fPrint != 0) {
      fprintf((FILE *)pFile,"%08x = %s\n",(ulong)tFun,sF);
    }
    return;
  }
  if (-1 < (int)uVar3) {
    lVar2 = 0;
    do {
      if (vLibImpl->nSize <= (int)uVar3) break;
      if (*(int *)((long)vLibImpl->pArray[uVar3] + 4) <= lVar2) {
        return;
      }
      iVar6 = 0;
      NP_00 = 0;
      uVar4 = NP;
      do {
        uVar5 = pFun->NP2 >> ((char)uVar4 * '\x04' & 0x1fU);
        bVar1 = (byte)iVar6 & 0x1f;
        NP_00 = NP_00 | ((uVar5 ^ uVar4) & 8 | uVar5 & 7) << bVar1;
        uVar4 = (int)uVar4 >> 4;
        iVar6 = iVar6 + 4;
      } while (iVar6 != 0x14);
      Dtt_MakeFormula(tFun,*(Dtt_FunImpl_t **)
                            (*(long *)((long)vLibImpl->pArray[uVar3] + 8) + lVar2 * 8),vLibImpl,
                      NP_00,local_98,0 << bVar1,pFile);
      Dtt_FunImpl2Str(pFun->Type,sFI1,local_98,sF);
      if (fPrint != 0) {
        fprintf((FILE *)pFile,"%08x = %s\n",(ulong)tFun,sF);
      }
      lVar2 = lVar2 + 1;
      uVar3 = pFun->FI2;
    } while (-1 < (int)uVar3);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

void Dtt_MakeFormulaFI2( unsigned tFun, Dtt_FunImpl_t* pFun, Vec_Vec_t* vLibImpl, int NP, char* sFI1, char* sF, int fPrint, FILE* pFile )
{
    int j;
    Dtt_FunImpl_t* pImpl2;
    char sFI2[100] = {0}; //sprintf( sFI2, "" );

    if ( pFun->FI2 == 0 ) // PI
    {
        Dtt_MakePI( Dtt_ComposeNP( pFun->NP2, NP ), sFI2 );
        Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, sF );
        if (fPrint)
            fprintf(pFile, "%08x = %s\n", tFun, sF);
    }
    else
    {
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pImpl2, j, pFun->FI2 )
        {
            Dtt_MakeFormula( tFun, pImpl2, vLibImpl, Dtt_ComposeNP( pFun->NP2, NP ), sFI2, 0, pFile );
            Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, sF );
            if (fPrint)
                fprintf(pFile, "%08x = %s\n", tFun, sF);
        }
    }   
}